

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O3

void re2c::prtHex(ostream *o,uint32_t c)

{
  type_t tVar1;
  opt_t *poVar2;
  ostream *poVar3;
  char local_20;
  char local_1f;
  char local_1e;
  char local_1d;
  char local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"0x",2);
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  tVar1 = (poVar2->encoding).type_;
  if (tVar1 < (UTF32|UCS2)) {
    if ((0x23U >> (tVar1 & 0x1f) & 1) != 0) goto LAB_00125cd6;
    if ((0xcU >> (tVar1 & 0x1f) & 1) == 0) goto LAB_00125c0b;
  }
  else {
LAB_00125c0b:
    local_20 = "0123456789ABCDEF"[c >> 0x1c];
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(o,&local_20,1);
    local_1f = "0123456789ABCDEF"[c >> 0x18 & 0xf];
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1f,1);
    local_1e = "0123456789ABCDEF"[c >> 0x14 & 0xf];
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1e,1);
    local_1d = "0123456789ABCDEF"[c >> 0x10 & 0xf];
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1d,1);
  }
  local_1c = "0123456789ABCDEF"[c >> 0xc & 0xf];
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(o,&local_1c,1);
  local_1b = "0123456789ABCDEF"[c >> 8 & 0xf];
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1b,1);
LAB_00125cd6:
  local_1a = "0123456789ABCDEF"[c >> 4 & 0xf];
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(o,&local_1a,1);
  local_19 = "0123456789ABCDEF"[c & 0xf];
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
  return;
}

Assistant:

void prtHex(std::ostream& o, uint32_t c)
{
	o << "0x";
	const uint32_t cunit_size = opts->encoding.szCodeUnit ();
	if (cunit_size >= 4)
	{
		o << hexCh (c >> 28u)
			<< hexCh (c >> 24u)
			<< hexCh (c >> 20u)
			<< hexCh (c >> 16u);
	}
	if (cunit_size >= 2)
	{
		o << hexCh (c >> 12u)
			<< hexCh (c >> 8u);
	}
	o << hexCh (c >> 4u)
		<< hexCh (c);
}